

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ContainerUtilities.h
# Opt level: O0

bool soul::
     removeIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *v,anon_class_1_0_00000001_for__M_pred *pred)

{
  bool bVar1;
  const_iterator local_58;
  const_iterator local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  newEnd;
  iterator oldEnd;
  anon_class_1_0_00000001_for__M_pred *pred_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v_local;
  
  newEnd._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(v);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(v);
  local_40 = newEnd._M_current;
  local_30 = std::
             remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                       (local_38,newEnd._M_current);
  bVar1 = __gnu_cxx::operator==(&local_30,&newEnd);
  if (!bVar1) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_50,&local_30);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_58,&newEnd);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(v,local_50,local_58);
  }
  v_local._7_1_ = !bVar1;
  return v_local._7_1_;
}

Assistant:

inline bool removeIf (Vector& v, Predicate&& pred)
{
    auto oldEnd = std::end (v);
    auto newEnd = std::remove_if (std::begin (v), oldEnd, pred);

    if (newEnd == oldEnd)
        return false;

    v.erase (newEnd, oldEnd);
    return true;
}